

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::InitializeAppend
          (RowGroupCollection *this,TransactionData transaction,TableAppendState *state)

{
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_00;
  __int_type _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var3;
  RowGroupSegmentTree *pRVar4;
  RowGroup *pRVar5;
  unique_lock<std::mutex> local_78;
  undefined8 local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  local_58;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Stack_40;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  local_38;
  
  _Var1 = (this->total_rows).super___atomic_base<unsigned_long>._M_i;
  state->row_start = _Var1;
  state->current_row = _Var1;
  state->total_append_count = 0;
  this_00 = &this->row_groups;
  pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  local_78._M_device = &(pRVar4->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_78._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_78);
  local_78._M_owns = true;
  pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  pRVar5 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                     (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_78);
  if (pRVar5 == (RowGroup *)0x0) {
    AppendRowGroup(this,(SegmentLock *)&local_78,this->row_start);
  }
  pRVar4 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  pRVar5 = SegmentTree<duckdb::RowGroup,_true>::GetLastSegment
                     (&pRVar4->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_78);
  state->start_row_group = pRVar5;
  RowGroup::InitializeAppend(pRVar5,&state->row_group_append_state);
  (state->transaction).start_time = transaction.start_time;
  (state->transaction).transaction.ptr = transaction.transaction.ptr;
  (state->transaction).transaction_id = transaction.transaction_id;
  local_58.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_40._M_head_impl = (BlockingSample *)0x0;
  local_58.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = 0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (state->stats).stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  this_01 = (state->stats).stats_lock.internal.
            super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (state->stats).stats_lock.internal.super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_38.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (state->stats).column_stats.
       super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (state->stats).column_stats.
       super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (state->stats).column_stats.
       super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       .
       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (state->stats).column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (state->stats).column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (state->stats).column_stats.
  super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ::~vector(&local_38);
  _Var3._M_head_impl = _Stack_40._M_head_impl;
  _Stack_40._M_head_impl = (BlockingSample *)0x0;
  _Var2._M_head_impl =
       (state->stats).table_sample.
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  (state->stats).table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (BlockingSample *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockingSample + 8))();
  }
  if (_Stack_40._M_head_impl != (BlockingSample *)0x0) {
    (**(code **)(*(long *)_Stack_40._M_head_impl + 8))();
  }
  _Stack_40._M_head_impl = (BlockingSample *)0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ::~vector(&local_58);
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  TableStatistics::InitializeEmpty(&state->stats,&this->types);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_78);
  return;
}

Assistant:

void RowGroupCollection::InitializeAppend(TransactionData transaction, TableAppendState &state) {
	state.row_start = UnsafeNumericCast<row_t>(total_rows.load());
	state.current_row = state.row_start;
	state.total_append_count = 0;

	// start writing to the row_groups
	auto l = row_groups->Lock();
	if (IsEmpty(l)) {
		// empty row group collection: empty first row group
		AppendRowGroup(l, row_start);
	}
	state.start_row_group = row_groups->GetLastSegment(l);
	D_ASSERT(this->row_start + total_rows == state.start_row_group->start + state.start_row_group->count);
	state.start_row_group->InitializeAppend(state.row_group_append_state);
	state.transaction = transaction;

	// initialize thread-local stats so we have less lock contention when updating distinct statistics
	state.stats = TableStatistics();
	state.stats.InitializeEmpty(types);
}